

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O1

void __thiscall w3Interp::If(w3Interp *this)

{
  w3Stack *this_00;
  pointer *ppwVar1;
  int iVar2;
  w3DecodedInstruction *pwVar3;
  Value *pVVar4;
  w3StackValue stack_value;
  w3StackValue local_48;
  
  this_00 = &this->super_w3Stack;
  pVVar4 = w3Stack::value(this_00,Tag_i32);
  iVar2 = pVVar4->i32;
  w3Stack::AssertTopIsValue(this_00);
  ppwVar1 = &(this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
             super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppwVar1 = *ppwVar1 + -1;
  local_48.tag = Tag_Label;
  local_48.value.tag = Tag_none;
  local_48.value._1_7_ = 0;
  local_48.value.value.u64 = 0;
  local_48.frame = (w3Frame *)0x0;
  pwVar3 = (this->super_Wasm).instr;
  local_48.label.arity =
       (size_t)((pwVar3->super_w3DecodedInstructionZeroInit).blockType != Tag_empty);
  local_48.label.continuation = (pwVar3->super_w3DecodedInstructionZeroInit).field_0.field_8.if_end;
  w3Stack::push_label(this_00,&local_48);
  if (iVar2 == 0) {
    (this->super_Wasm).instr =
         (this->frame->code->decoded_instructions).
         super__Vector_base<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_>._M_impl.
         super__Vector_impl_data._M_start +
         ((((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u64 - 1);
  }
  return;
}

Assistant:

INTERP (If)
{
     __debugbreak ();

    const uint32_t condition = pop_u32 ();

    // Push the same label either way.
    w3StackValue stack_value (Tag_Label);
    stack_value.label.arity = instr->Arity ();
    stack_value.label.continuation = instr->if_end;
    push_label (stack_value);

    // If condition is false, skip ahead, to just past the Else.
    // The Else actually marks the end of If, more than the start of Else.
    if (!condition)
    {
        // Branch to one before target, because interpreter loop will increment.
        instr = &frame->code->decoded_instructions [instr->if_false] - 1;
    }
}